

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_luma_vert_w16inp_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar77;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  int in_R9D;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  __m128i s35_8x16b;
  __m128i s34_8x16b;
  __m128i s33_8x16b;
  __m128i s32_8x16b;
  __m128i s31_8x16b;
  __m128i s30_8x16b;
  __m128i s29_8x16b;
  __m128i s28_8x16b;
  __m128i s26_8x16b;
  __m128i s25_8x16b;
  __m128i s24_8x16b;
  __m128i s23_8x16b;
  __m128i s22_8x16b;
  __m128i s21_8x16b;
  __m128i s20_8x16b;
  __m128i s19_8x16b;
  __m128i s18_8x16b;
  __m128i s16_8x16b;
  __m128i s15_8x16b;
  __m128i s14_8x16b;
  __m128i s13_8x16b;
  __m128i s12_8x16b;
  __m128i s11_8x16b;
  __m128i s10_8x16b;
  __m128i s4_4_16x8b;
  __m128i s4_3_16x8b;
  __m128i s4_2_16x8b;
  __m128i s4_1_16x8b;
  __m128i s4_0_16x8b;
  __m128i s3_4_16x8b;
  __m128i s3_3_16x8b;
  __m128i s3_2_16x8b;
  __m128i s3_1_16x8b;
  __m128i s3_0_16x8b;
  __m128i s2_10_16x8b;
  __m128i s2_9_16x8b;
  __m128i s2_8_16x8b;
  __m128i s2_7_16x8b;
  __m128i s2_6_16x8b;
  __m128i s2_5_16x8b;
  __m128i s2_4_16x8b;
  __m128i s2_3_16x8b;
  __m128i s2_2_16x8b;
  __m128i s2_1_16x8b;
  __m128i s2_0_16x8b;
  __m128i s9_8x16b;
  __m128i s8_8x16b;
  __m128i s6_8x16b;
  __m128i s5_8x16b;
  __m128i s4_8x16b;
  __m128i s3_8x16b;
  __m128i s2_8x16b;
  __m128i s1_8x16b;
  __m128i s0_8x16b;
  __m128i coeff6_7_8x16b;
  __m128i coeff4_5_8x16b;
  __m128i coeff2_3_8x16b;
  __m128i coeff0_1_8x16b;
  UWORD8 *pu1_dst_copy;
  WORD16 *pi2_src_copy;
  WORD32 col;
  WORD32 row;
  undefined4 local_1988;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined4 local_18f8;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined4 local_1868;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined2 uStack_17d6;
  undefined2 uStack_17d2;
  undefined2 uStack_17ce;
  undefined2 uStack_17ca;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a0;
  undefined8 uStack_1790;
  undefined2 local_1788;
  undefined2 uStack_1786;
  undefined2 uStack_1784;
  undefined2 uStack_1782;
  undefined2 uStack_1780;
  undefined2 uStack_177e;
  undefined2 uStack_177c;
  undefined2 uStack_177a;
  undefined2 local_1778;
  undefined2 uStack_1776;
  undefined2 uStack_1774;
  undefined2 uStack_1772;
  undefined2 uStack_1770;
  undefined2 uStack_176e;
  undefined2 uStack_176c;
  undefined2 uStack_176a;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1750;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined4 local_1688;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined4 uStack_1654;
  undefined4 uStack_1650;
  undefined4 uStack_164c;
  undefined4 local_15a4;
  undefined4 local_15a0;
  undefined8 local_1588;
  undefined8 local_1580;
  undefined2 local_1148;
  undefined2 uStack_1146;
  undefined2 uStack_1144;
  undefined2 uStack_1142;
  undefined2 local_1128;
  undefined2 uStack_1126;
  undefined2 uStack_1124;
  undefined2 uStack_1122;
  undefined2 local_1108;
  undefined2 uStack_1106;
  undefined2 uStack_1104;
  undefined2 uStack_1102;
  undefined2 local_10e8;
  undefined2 uStack_10e6;
  undefined2 uStack_10e4;
  undefined2 uStack_10e2;
  undefined2 local_10c8;
  undefined2 uStack_10c6;
  undefined2 uStack_10c4;
  undefined2 uStack_10c2;
  undefined2 local_10a8;
  undefined2 uStack_10a6;
  undefined2 uStack_10a4;
  undefined2 uStack_10a2;
  undefined2 local_1088;
  undefined2 uStack_1086;
  undefined2 uStack_1084;
  undefined2 uStack_1082;
  undefined2 local_1068;
  undefined2 uStack_1066;
  undefined2 uStack_1064;
  undefined2 uStack_1062;
  undefined1 local_ce8;
  undefined1 uStack_ce7;
  undefined1 uStack_ce6;
  undefined1 uStack_ce5;
  undefined1 uStack_ce4;
  undefined1 uStack_ce3;
  undefined1 uStack_ce2;
  undefined1 uStack_ce1;
  undefined2 local_cc8;
  undefined2 uStack_cc6;
  undefined2 uStack_cc4;
  undefined2 uStack_cc2;
  undefined2 local_c88;
  undefined2 uStack_c86;
  undefined2 uStack_c84;
  undefined2 uStack_c82;
  undefined2 local_c78;
  undefined2 uStack_c76;
  undefined2 uStack_c74;
  undefined2 uStack_c72;
  undefined2 local_c68;
  undefined2 uStack_c66;
  undefined2 uStack_c64;
  undefined2 uStack_c62;
  undefined2 local_c58;
  undefined2 uStack_c56;
  undefined2 uStack_c54;
  undefined2 uStack_c52;
  undefined2 local_c48;
  undefined2 uStack_c46;
  undefined2 uStack_c44;
  undefined2 uStack_c42;
  undefined2 local_ba8;
  undefined2 uStack_ba6;
  undefined2 uStack_ba4;
  undefined2 uStack_ba2;
  undefined2 local_b98;
  undefined2 uStack_b96;
  undefined2 uStack_b94;
  undefined2 uStack_b92;
  undefined2 local_b88;
  undefined2 uStack_b86;
  undefined2 uStack_b84;
  undefined2 uStack_b82;
  undefined2 local_b78;
  undefined2 uStack_b76;
  undefined2 uStack_b74;
  undefined2 uStack_b72;
  undefined2 local_b68;
  undefined2 uStack_b66;
  undefined2 uStack_b64;
  undefined2 uStack_b62;
  undefined2 uStack_b56;
  undefined2 uStack_b54;
  undefined2 uStack_b52;
  undefined2 local_b48;
  undefined2 uStack_b46;
  undefined2 uStack_b44;
  undefined2 uStack_b42;
  undefined2 uStack_b36;
  undefined2 uStack_b34;
  undefined2 uStack_b32;
  undefined2 local_b28;
  undefined2 uStack_b26;
  undefined2 uStack_b24;
  undefined2 uStack_b22;
  undefined2 uStack_b16;
  undefined2 uStack_b14;
  undefined2 uStack_b12;
  undefined4 local_6c8;
  undefined4 uStack_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined4 local_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 local_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 local_628;
  undefined4 uStack_624;
  undefined4 uStack_620;
  undefined4 uStack_61c;
  undefined4 local_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 local_5c8;
  undefined4 uStack_5c4;
  undefined4 uStack_5c0;
  undefined4 uStack_5bc;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 local_548;
  undefined4 uStack_544;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 local_528;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined4 local_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined4 local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  __m128i sign_reg;
  __m128i mask_high_96b;
  __m128i mask_low_32b;
  __m128i offset_8x16b;
  __m128i zero_8x16b;
  __m128i s39_8x16b;
  __m128i s38_8x16b;
  __m128i s36_8x16b;
  
  lVar1 = *in_R8;
  local_ce8 = (char)lVar1;
  uStack_ce7 = (char)((ulong)lVar1 >> 8);
  uStack_ce6 = (char)((ulong)lVar1 >> 0x10);
  uStack_ce5 = (char)((ulong)lVar1 >> 0x18);
  uStack_ce4 = (char)((ulong)lVar1 >> 0x20);
  uStack_ce3 = (char)((ulong)lVar1 >> 0x28);
  uStack_ce2 = (char)((ulong)lVar1 >> 0x30);
  uStack_ce1 = (undefined1)((ulong)lVar1 >> 0x38);
  uVar77 = CONCAT13(-(uStack_ce7 < '\0'),
                    CONCAT12(uStack_ce7,CONCAT11(-(local_ce8 < '\0'),local_ce8)));
  uStack_1650 = CONCAT13(-(uStack_ce3 < '\0'),
                         CONCAT12(uStack_ce3,CONCAT11(-(uStack_ce4 < '\0'),uStack_ce4)));
  _uStack_1650 = CONCAT17(-(lVar1 < 0),
                          CONCAT16(uStack_ce1,
                                   CONCAT15(-(uStack_ce2 < '\0'),CONCAT14(uStack_ce2,uStack_1650))))
  ;
  uStack_1654 = (undefined4)
                (CONCAT17(-(uStack_ce5 < '\0'),
                          CONCAT16(uStack_ce5,
                                   CONCAT15(-(uStack_ce6 < '\0'),CONCAT14(uStack_ce6,uVar77)))) >>
                0x20);
  for (local_15a4 = 0; local_15a4 < (int)s35_8x16b[1]; local_15a4 = local_15a4 + 4) {
    local_1580 = (undefined8 *)(in_RDI + (long)local_15a4 * 2);
    local_1588 = (ulong *)(in_RSI + local_15a4);
    uVar2 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * -3) * 2);
    uVar3 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * -2) * 2);
    uStack_b16 = (undefined2)((ulong)uVar2 >> 0x10);
    uStack_b14 = (undefined2)((ulong)uVar2 >> 0x20);
    uStack_b12 = (undefined2)((ulong)uVar2 >> 0x30);
    local_b28 = (undefined2)uVar3;
    uStack_b26 = (undefined2)((ulong)uVar3 >> 0x10);
    uStack_b24 = (undefined2)((ulong)uVar3 >> 0x20);
    uStack_b22 = (undefined2)((ulong)uVar3 >> 0x30);
    auVar68._2_2_ = local_b28;
    auVar68._0_2_ = (short)uVar2;
    auVar68._4_2_ = uStack_b16;
    auVar68._6_2_ = uStack_b26;
    uStack_1740 = CONCAT26(uStack_b22,CONCAT24(uStack_b12,CONCAT22(uStack_b24,uStack_b14)));
    auVar67._4_4_ = uVar77;
    auVar67._0_4_ = uVar77;
    auVar67._12_4_ = uVar77;
    auVar67._8_4_ = uVar77;
    auVar68._8_8_ = uStack_1740;
    auVar78 = pmaddwd(auVar68,auVar67);
    uVar2 = *(undefined8 *)((long)local_1580 + (long)-in_EDX * 2);
    uVar3 = *local_1580;
    uStack_b36 = (undefined2)((ulong)uVar2 >> 0x10);
    uStack_b34 = (undefined2)((ulong)uVar2 >> 0x20);
    uStack_b32 = (undefined2)((ulong)uVar2 >> 0x30);
    local_b48 = (undefined2)uVar3;
    uStack_b46 = (undefined2)((ulong)uVar3 >> 0x10);
    uStack_b44 = (undefined2)((ulong)uVar3 >> 0x20);
    uStack_b42 = (undefined2)((ulong)uVar3 >> 0x30);
    uVar6 = CONCAT26(uStack_b46,CONCAT24(uStack_b36,CONCAT22(local_b48,(short)uVar2)));
    uStack_1750 = CONCAT26(uStack_b42,CONCAT24(uStack_b32,CONCAT22(uStack_b44,uStack_b34)));
    auVar65._4_4_ = uStack_1654;
    auVar65._0_4_ = uStack_1654;
    auVar65._12_4_ = uStack_1654;
    auVar65._8_4_ = uStack_1654;
    auVar66._8_8_ = uStack_1750;
    auVar66._0_8_ = uVar6;
    auVar79 = pmaddwd(auVar66,auVar65);
    uVar3 = *(undefined8 *)((long)local_1580 + (long)in_EDX * 2);
    uVar4 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * 2) * 2);
    uStack_b56 = (undefined2)((ulong)uVar3 >> 0x10);
    uStack_b54 = (undefined2)((ulong)uVar3 >> 0x20);
    uStack_b52 = (undefined2)((ulong)uVar3 >> 0x30);
    local_b68 = (undefined2)uVar4;
    uStack_b66 = (undefined2)((ulong)uVar4 >> 0x10);
    uStack_b64 = (undefined2)((ulong)uVar4 >> 0x20);
    uStack_b62 = (undefined2)((ulong)uVar4 >> 0x30);
    local_1768 = CONCAT26(uStack_b66,CONCAT24(uStack_b56,CONCAT22(local_b68,(short)uVar3)));
    uStack_1760 = CONCAT26(uStack_b62,CONCAT24(uStack_b52,CONCAT22(uStack_b64,uStack_b54)));
    auVar63._4_4_ = uStack_1650;
    auVar63._0_4_ = uStack_1650;
    auVar63._12_4_ = uStack_1650;
    auVar63._8_4_ = uStack_1650;
    auVar64._8_8_ = uStack_1760;
    auVar64._0_8_ = local_1768;
    auVar80 = pmaddwd(auVar64,auVar63);
    uVar4 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * 3) * 2);
    uVar5 = *(undefined8 *)((long)local_1580 + (long)(in_EDX << 2) * 2);
    local_b78 = (undefined2)uVar4;
    uStack_b76 = (undefined2)((ulong)uVar4 >> 0x10);
    uStack_b74 = (undefined2)((ulong)uVar4 >> 0x20);
    uStack_b72 = (undefined2)((ulong)uVar4 >> 0x30);
    local_b88 = (undefined2)uVar5;
    uStack_b86 = (undefined2)((ulong)uVar5 >> 0x10);
    uStack_b84 = (undefined2)((ulong)uVar5 >> 0x20);
    uStack_b82 = (undefined2)((ulong)uVar5 >> 0x30);
    local_1778 = local_b78;
    uStack_1776 = local_b88;
    uStack_1774 = uStack_b76;
    uStack_1772 = uStack_b86;
    uStack_1770 = uStack_b74;
    uStack_176e = uStack_b84;
    uStack_176c = uStack_b72;
    uStack_176a = uStack_b82;
    auVar62._2_2_ = local_b88;
    auVar62._0_2_ = local_b78;
    auVar62._4_2_ = uStack_b76;
    auVar62._6_2_ = uStack_b86;
    auVar62._10_2_ = uStack_b84;
    auVar62._8_2_ = uStack_b74;
    auVar62._12_2_ = uStack_b72;
    auVar62._14_2_ = uStack_b82;
    auVar61._4_4_ = uStack_164c;
    auVar61._0_4_ = uStack_164c;
    auVar61._12_4_ = uStack_164c;
    auVar61._8_4_ = uStack_164c;
    auVar81 = pmaddwd(auVar62,auVar61);
    local_318 = auVar78._0_4_;
    uStack_314 = auVar78._4_4_;
    uStack_310 = auVar78._8_4_;
    uStack_30c = auVar78._12_4_;
    local_328 = auVar79._0_4_;
    uStack_324 = auVar79._4_4_;
    uStack_320 = auVar79._8_4_;
    uStack_31c = auVar79._12_4_;
    local_338 = auVar80._0_4_;
    uStack_334 = auVar80._4_4_;
    uStack_330 = auVar80._8_4_;
    uStack_32c = auVar80._12_4_;
    local_348 = auVar81._0_4_;
    uStack_344 = auVar81._4_4_;
    uStack_340 = auVar81._8_4_;
    uStack_33c = auVar81._12_4_;
    auVar78 = ZEXT416(6);
    auVar79 = ZEXT416(6);
    local_1678 = CONCAT44((uStack_314 + uStack_324 + uStack_334 + uStack_344 >> auVar78) + 0x20 >>
                          auVar79,(local_318 + local_328 + local_338 + local_348 >> auVar78) + 0x20
                                  >> auVar79);
    uStack_1670._0_4_ =
         (uStack_310 + uStack_320 + uStack_330 + uStack_340 >> auVar78) + 0x20 >> auVar79;
    uStack_1670._4_4_ =
         (uStack_30c + uStack_31c + uStack_32c + uStack_33c >> auVar78) + 0x20 >> auVar79;
    auVar76._8_8_ = uStack_1670;
    auVar76._0_8_ = local_1678;
    auVar78 = packssdw(auVar76,ZEXT816(0));
    local_1068 = auVar78._0_2_;
    uStack_1066 = auVar78._2_2_;
    uStack_1064 = auVar78._4_2_;
    uStack_1062 = auVar78._6_2_;
    local_1688._0_2_ =
         CONCAT11((0 < uStack_1066) * (uStack_1066 < 0x100) * auVar78[2] - (0xff < uStack_1066),
                  (0 < local_1068) * (local_1068 < 0x100) * auVar78[0] - (0xff < local_1068));
    local_1688._0_3_ =
         CONCAT12((0 < uStack_1064) * (uStack_1064 < 0x100) * auVar78[4] - (0xff < uStack_1064),
                  (undefined2)local_1688);
    local_1688 = CONCAT13((0 < uStack_1062) * (uStack_1062 < 0x100) * auVar78[6] -
                          (0xff < uStack_1062),(undefined3)local_1688);
    *local_1588 = *local_1588 & 0xffffffff00000000 | (ulong)local_1688;
    auVar59._4_4_ = uVar77;
    auVar59._0_4_ = uVar77;
    auVar59._12_4_ = uVar77;
    auVar59._8_4_ = uVar77;
    auVar60._8_8_ = uStack_1750;
    auVar60._0_8_ = uVar6;
    auVar78 = pmaddwd(auVar60,auVar59);
    auVar57._4_4_ = uStack_1654;
    auVar57._0_4_ = uStack_1654;
    auVar57._12_4_ = uStack_1654;
    auVar57._8_4_ = uStack_1654;
    auVar58._8_8_ = uStack_1760;
    auVar58._0_8_ = local_1768;
    auVar79 = pmaddwd(auVar58,auVar57);
    auVar56._2_2_ = local_b88;
    auVar56._0_2_ = local_b78;
    auVar56._4_2_ = uStack_b76;
    auVar56._6_2_ = uStack_b86;
    auVar56._10_2_ = uStack_b84;
    auVar56._8_2_ = uStack_b74;
    auVar56._12_2_ = uStack_b72;
    auVar56._14_2_ = uStack_b82;
    auVar55._4_4_ = uStack_1650;
    auVar55._0_4_ = uStack_1650;
    auVar55._12_4_ = uStack_1650;
    auVar55._8_4_ = uStack_1650;
    auVar80 = pmaddwd(auVar56,auVar55);
    uVar4 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * 5) * 2);
    uVar5 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * 6) * 2);
    local_b98 = (undefined2)uVar4;
    uStack_b96 = (undefined2)((ulong)uVar4 >> 0x10);
    uStack_b94 = (undefined2)((ulong)uVar4 >> 0x20);
    uStack_b92 = (undefined2)((ulong)uVar4 >> 0x30);
    local_ba8 = (undefined2)uVar5;
    uStack_ba6 = (undefined2)((ulong)uVar5 >> 0x10);
    uStack_ba4 = (undefined2)((ulong)uVar5 >> 0x20);
    uStack_ba2 = (undefined2)((ulong)uVar5 >> 0x30);
    local_1788 = local_b98;
    uStack_1786 = local_ba8;
    uStack_1784 = uStack_b96;
    uStack_1782 = uStack_ba6;
    uStack_1780 = uStack_b94;
    uStack_177e = uStack_ba4;
    uStack_177c = uStack_b92;
    uStack_177a = uStack_ba2;
    auVar54._2_2_ = local_ba8;
    auVar54._0_2_ = local_b98;
    auVar54._4_2_ = uStack_b96;
    auVar54._6_2_ = uStack_ba6;
    auVar54._10_2_ = uStack_ba4;
    auVar54._8_2_ = uStack_b94;
    auVar54._12_2_ = uStack_b92;
    auVar54._14_2_ = uStack_ba2;
    auVar53._4_4_ = uStack_164c;
    auVar53._0_4_ = uStack_164c;
    auVar53._12_4_ = uStack_164c;
    auVar53._8_4_ = uStack_164c;
    auVar81 = pmaddwd(auVar54,auVar53);
    local_398 = auVar78._0_4_;
    uStack_394 = auVar78._4_4_;
    uStack_390 = auVar78._8_4_;
    uStack_38c = auVar78._12_4_;
    local_3a8 = auVar79._0_4_;
    uStack_3a4 = auVar79._4_4_;
    uStack_3a0 = auVar79._8_4_;
    uStack_39c = auVar79._12_4_;
    local_3b8 = auVar80._0_4_;
    uStack_3b4 = auVar80._4_4_;
    uStack_3b0 = auVar80._8_4_;
    uStack_3ac = auVar80._12_4_;
    local_3c8 = auVar81._0_4_;
    uStack_3c4 = auVar81._4_4_;
    uStack_3c0 = auVar81._8_4_;
    uStack_3bc = auVar81._12_4_;
    auVar78 = ZEXT416(6);
    auVar79 = ZEXT416(6);
    local_18e8 = CONCAT44((uStack_394 + uStack_3a4 + uStack_3b4 + uStack_3c4 >> auVar78) + 0x20 >>
                          auVar79,(local_398 + local_3a8 + local_3b8 + local_3c8 >> auVar78) + 0x20
                                  >> auVar79);
    uStack_18e0._0_4_ =
         (uStack_390 + uStack_3a0 + uStack_3b0 + uStack_3c0 >> auVar78) + 0x20 >> auVar79;
    uStack_18e0._4_4_ =
         (uStack_38c + uStack_39c + uStack_3ac + uStack_3bc >> auVar78) + 0x20 >> auVar79;
    auVar75._8_8_ = uStack_18e0;
    auVar75._0_8_ = local_18e8;
    auVar78 = packssdw(auVar75,ZEXT816(0));
    local_1088 = auVar78._0_2_;
    uStack_1086 = auVar78._2_2_;
    uStack_1084 = auVar78._4_2_;
    uStack_1082 = auVar78._6_2_;
    local_18f8._0_2_ =
         CONCAT11((0 < uStack_1086) * (uStack_1086 < 0x100) * auVar78[2] - (0xff < uStack_1086),
                  (0 < local_1088) * (local_1088 < 0x100) * auVar78[0] - (0xff < local_1088));
    local_18f8._0_3_ =
         CONCAT12((0 < uStack_1084) * (uStack_1084 < 0x100) * auVar78[4] - (0xff < uStack_1084),
                  (undefined2)local_18f8);
    local_18f8 = CONCAT13((0 < uStack_1082) * (uStack_1082 < 0x100) * auVar78[6] -
                          (0xff < uStack_1082),(undefined3)local_18f8);
    *(ulong *)((long)local_1588 + (long)(in_ECX * 2)) =
         *(ulong *)((long)local_1588 + (long)(in_ECX * 2)) & 0xffffffff00000000 | (ulong)local_18f8;
    auVar52._2_2_ = (short)uVar2;
    auVar52._0_2_ = local_b28;
    auVar52._4_2_ = uStack_b26;
    auVar52._6_2_ = uStack_b36;
    uStack_1790 = CONCAT26(uStack_b32,CONCAT24(uStack_b22,CONCAT22(uStack_b34,uStack_b24)));
    auVar51._4_4_ = uVar77;
    auVar51._0_4_ = uVar77;
    auVar51._12_4_ = uVar77;
    auVar51._8_4_ = uVar77;
    auVar52._8_8_ = uStack_1790;
    auVar78 = pmaddwd(auVar52,auVar51);
    uVar2 = CONCAT26(uStack_b56,CONCAT24(uStack_b46,CONCAT22((short)uVar3,local_b48)));
    uStack_17a0 = CONCAT26(uStack_b52,CONCAT24(uStack_b42,CONCAT22(uStack_b54,uStack_b44)));
    auVar49._4_4_ = uStack_1654;
    auVar49._0_4_ = uStack_1654;
    auVar49._12_4_ = uStack_1654;
    auVar49._8_4_ = uStack_1654;
    auVar50._8_8_ = uStack_17a0;
    auVar50._0_8_ = uVar2;
    auVar79 = pmaddwd(auVar50,auVar49);
    local_17b8 = CONCAT26(uStack_b76,CONCAT24(uStack_b66,CONCAT22(local_b78,local_b68)));
    uStack_17b0 = CONCAT26(uStack_b72,CONCAT24(uStack_b62,CONCAT22(uStack_b74,uStack_b64)));
    auVar47._4_4_ = uStack_1650;
    auVar47._0_4_ = uStack_1650;
    auVar47._12_4_ = uStack_1650;
    auVar47._8_4_ = uStack_1650;
    auVar48._8_8_ = uStack_17b0;
    auVar48._0_8_ = local_17b8;
    auVar80 = pmaddwd(auVar48,auVar47);
    auVar46._2_2_ = local_b98;
    auVar46._0_2_ = local_b88;
    auVar46._4_2_ = uStack_b86;
    auVar46._6_2_ = uStack_b96;
    auVar46._10_2_ = uStack_b94;
    auVar46._8_2_ = uStack_b84;
    auVar46._12_2_ = uStack_b82;
    auVar46._14_2_ = uStack_b92;
    auVar45._4_4_ = uStack_164c;
    auVar45._0_4_ = uStack_164c;
    auVar45._12_4_ = uStack_164c;
    auVar45._8_4_ = uStack_164c;
    auVar81 = pmaddwd(auVar46,auVar45);
    local_418 = auVar78._0_4_;
    uStack_414 = auVar78._4_4_;
    uStack_410 = auVar78._8_4_;
    uStack_40c = auVar78._12_4_;
    local_428 = auVar79._0_4_;
    uStack_424 = auVar79._4_4_;
    uStack_420 = auVar79._8_4_;
    uStack_41c = auVar79._12_4_;
    local_438 = auVar80._0_4_;
    uStack_434 = auVar80._4_4_;
    uStack_430 = auVar80._8_4_;
    uStack_42c = auVar80._12_4_;
    local_448 = auVar81._0_4_;
    uStack_444 = auVar81._4_4_;
    uStack_440 = auVar81._8_4_;
    uStack_43c = auVar81._12_4_;
    auVar78 = ZEXT416(6);
    auVar79 = ZEXT416(6);
    local_1858 = CONCAT44((uStack_414 + uStack_424 + uStack_434 + uStack_444 >> auVar78) + 0x20 >>
                          auVar79,(local_418 + local_428 + local_438 + local_448 >> auVar78) + 0x20
                                  >> auVar79);
    uStack_1850._0_4_ =
         (uStack_410 + uStack_420 + uStack_430 + uStack_440 >> auVar78) + 0x20 >> auVar79;
    uStack_1850._4_4_ =
         (uStack_40c + uStack_41c + uStack_42c + uStack_43c >> auVar78) + 0x20 >> auVar79;
    auVar74._8_8_ = uStack_1850;
    auVar74._0_8_ = local_1858;
    auVar78 = packssdw(auVar74,ZEXT816(0));
    local_10a8 = auVar78._0_2_;
    uStack_10a6 = auVar78._2_2_;
    uStack_10a4 = auVar78._4_2_;
    uStack_10a2 = auVar78._6_2_;
    local_1868._0_2_ =
         CONCAT11((0 < uStack_10a6) * (uStack_10a6 < 0x100) * auVar78[2] - (0xff < uStack_10a6),
                  (0 < local_10a8) * (local_10a8 < 0x100) * auVar78[0] - (0xff < local_10a8));
    local_1868._0_3_ =
         CONCAT12((0 < uStack_10a4) * (uStack_10a4 < 0x100) * auVar78[4] - (0xff < uStack_10a4),
                  (undefined2)local_1868);
    local_1868 = CONCAT13((0 < uStack_10a2) * (uStack_10a2 < 0x100) * auVar78[6] -
                          (0xff < uStack_10a2),(undefined3)local_1868);
    *(ulong *)((long)local_1588 + (long)in_ECX) =
         *(ulong *)((long)local_1588 + (long)in_ECX) & 0xffffffff00000000 | (ulong)local_1868;
    auVar82._4_4_ = uVar77;
    auVar82._0_4_ = uVar77;
    auVar82._12_4_ = uVar77;
    auVar82._8_4_ = uVar77;
    auVar44._8_8_ = uStack_17a0;
    auVar44._0_8_ = uVar2;
    auVar82 = pmaddwd(auVar44,auVar82);
    auVar83._4_4_ = uStack_1654;
    auVar83._0_4_ = uStack_1654;
    auVar83._12_4_ = uStack_1654;
    auVar83._8_4_ = uStack_1654;
    auVar43._8_8_ = uStack_17b0;
    auVar43._0_8_ = local_17b8;
    auVar83 = pmaddwd(auVar43,auVar83);
    auVar81._2_2_ = local_b98;
    auVar81._0_2_ = local_b88;
    auVar81._4_2_ = uStack_b86;
    auVar81._6_2_ = uStack_b96;
    auVar81._10_2_ = uStack_b94;
    auVar81._8_2_ = uStack_b84;
    auVar81._12_2_ = uStack_b82;
    auVar81._14_2_ = uStack_b92;
    auVar80._4_4_ = uStack_1650;
    auVar80._0_4_ = uStack_1650;
    auVar80._12_4_ = uStack_1650;
    auVar80._8_4_ = uStack_1650;
    auVar80 = pmaddwd(auVar81,auVar80);
    local_1738 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * 7) * 2);
    local_c48 = (undefined2)local_1738;
    uStack_c46 = (undefined2)((ulong)local_1738 >> 0x10);
    uStack_c44 = (undefined2)((ulong)local_1738 >> 0x20);
    uStack_c42 = (undefined2)((ulong)local_1738 >> 0x30);
    uStack_17d6 = local_c48;
    uStack_17d2 = uStack_c46;
    uStack_17ce = uStack_c44;
    uStack_17ca = uStack_c42;
    auVar79._2_2_ = local_c48;
    auVar79._0_2_ = local_ba8;
    auVar79._4_2_ = uStack_ba6;
    auVar79._6_2_ = uStack_c46;
    auVar79._10_2_ = uStack_c44;
    auVar79._8_2_ = uStack_ba4;
    auVar79._12_2_ = uStack_ba2;
    auVar79._14_2_ = uStack_c42;
    auVar78._4_4_ = uStack_164c;
    auVar78._0_4_ = uStack_164c;
    auVar78._12_4_ = uStack_164c;
    auVar78._8_4_ = uStack_164c;
    auVar78 = pmaddwd(auVar79,auVar78);
    local_498 = auVar82._0_4_;
    uStack_494 = auVar82._4_4_;
    uStack_490 = auVar82._8_4_;
    uStack_48c = auVar82._12_4_;
    local_4a8 = auVar83._0_4_;
    uStack_4a4 = auVar83._4_4_;
    uStack_4a0 = auVar83._8_4_;
    uStack_49c = auVar83._12_4_;
    local_4b8 = auVar80._0_4_;
    uStack_4b4 = auVar80._4_4_;
    uStack_4b0 = auVar80._8_4_;
    uStack_4ac = auVar80._12_4_;
    local_4c8 = auVar78._0_4_;
    uStack_4c4 = auVar78._4_4_;
    uStack_4c0 = auVar78._8_4_;
    uStack_4bc = auVar78._12_4_;
    auVar78 = ZEXT416(6);
    auVar79 = ZEXT416(6);
    local_1978 = CONCAT44((uStack_494 + uStack_4a4 + uStack_4b4 + uStack_4c4 >> auVar78) + 0x20 >>
                          auVar79,(local_498 + local_4a8 + local_4b8 + local_4c8 >> auVar78) + 0x20
                                  >> auVar79);
    uStack_1970._0_4_ =
         (uStack_490 + uStack_4a0 + uStack_4b0 + uStack_4c0 >> auVar78) + 0x20 >> auVar79;
    uStack_1970._4_4_ =
         (uStack_48c + uStack_49c + uStack_4ac + uStack_4bc >> auVar78) + 0x20 >> auVar79;
    auVar73._8_8_ = uStack_1970;
    auVar73._0_8_ = local_1978;
    auVar78 = packssdw(auVar73,ZEXT816(0));
    local_10c8 = auVar78._0_2_;
    uStack_10c6 = auVar78._2_2_;
    uStack_10c4 = auVar78._4_2_;
    uStack_10c2 = auVar78._6_2_;
    local_1988._0_2_ =
         CONCAT11((0 < uStack_10c6) * (uStack_10c6 < 0x100) * auVar78[2] - (0xff < uStack_10c6),
                  (0 < local_10c8) * (local_10c8 < 0x100) * auVar78[0] - (0xff < local_10c8));
    local_1988._0_3_ =
         CONCAT12((0 < uStack_10c4) * (uStack_10c4 < 0x100) * auVar78[4] - (0xff < uStack_10c4),
                  (undefined2)local_1988);
    local_1988 = CONCAT13((0 < uStack_10c2) * (uStack_10c2 < 0x100) * auVar78[6] -
                          (0xff < uStack_10c2),(undefined3)local_1988);
    *(ulong *)((long)local_1588 + (long)(in_ECX * 3)) =
         *(ulong *)((long)local_1588 + (long)(in_ECX * 3)) & 0xffffffff00000000 | (ulong)local_1988;
    local_1580 = (undefined8 *)((long)local_1580 + (long)(in_EDX << 3) * 2);
    local_1588 = (ulong *)((long)local_1588 + (long)(in_ECX << 2));
    for (local_15a0 = 4; local_15a0 < in_R9D; local_15a0 = local_15a0 + 4) {
      uVar3 = CONCAT26(uStack_1772,CONCAT24(uStack_1774,CONCAT22(uStack_1776,local_1778)));
      uVar10 = CONCAT26(uStack_176a,CONCAT24(uStack_176c,CONCAT22(uStack_176e,uStack_1770)));
      uVar8 = CONCAT26(uStack_1782,CONCAT24(uStack_1784,CONCAT22(uStack_1786,local_1788)));
      uVar9 = CONCAT26(uStack_177a,CONCAT24(uStack_177c,CONCAT22(uStack_177e,uStack_1780)));
      auVar41._4_4_ = uVar77;
      auVar41._0_4_ = uVar77;
      auVar41._12_4_ = uVar77;
      auVar41._8_4_ = uVar77;
      auVar42._8_8_ = uStack_1760;
      auVar42._0_8_ = local_1768;
      auVar78 = pmaddwd(auVar42,auVar41);
      auVar39._4_4_ = uStack_1654;
      auVar39._0_4_ = uStack_1654;
      auVar39._12_4_ = uStack_1654;
      auVar39._8_4_ = uStack_1654;
      auVar40._8_8_ = uVar10;
      auVar40._0_8_ = uVar3;
      auVar79 = pmaddwd(auVar40,auVar39);
      auVar37._4_4_ = uStack_1650;
      auVar37._0_4_ = uStack_1650;
      auVar37._12_4_ = uStack_1650;
      auVar37._8_4_ = uStack_1650;
      auVar38._8_8_ = uVar9;
      auVar38._0_8_ = uVar8;
      auVar80 = pmaddwd(auVar38,auVar37);
      uVar2 = *local_1580;
      local_c58 = (undefined2)local_1738;
      local_1778 = local_c58;
      uStack_c56 = (undefined2)((ulong)local_1738 >> 0x10);
      uStack_1774 = uStack_c56;
      uStack_c54 = (undefined2)((ulong)local_1738 >> 0x20);
      uStack_1770 = uStack_c54;
      uStack_c52 = (undefined2)((ulong)local_1738 >> 0x30);
      uStack_176c = uStack_c52;
      local_c68 = (undefined2)uVar2;
      uStack_c66 = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_c64 = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_c62 = (undefined2)((ulong)uVar2 >> 0x30);
      auVar36._2_2_ = local_c68;
      auVar36._0_2_ = local_c58;
      auVar36._4_2_ = uStack_c56;
      auVar36._6_2_ = uStack_c66;
      auVar36._10_2_ = uStack_c64;
      auVar36._8_2_ = uStack_c54;
      auVar36._12_2_ = uStack_c52;
      auVar36._14_2_ = uStack_c62;
      auVar35._4_4_ = uStack_164c;
      auVar35._0_4_ = uStack_164c;
      auVar35._12_4_ = uStack_164c;
      auVar35._8_4_ = uStack_164c;
      auVar81 = pmaddwd(auVar36,auVar35);
      uVar6 = CONCAT26(uStack_1784,CONCAT24(uStack_1772,CONCAT22(local_1788,uStack_1776)));
      uVar7 = CONCAT26(uStack_177c,CONCAT24(uStack_176a,CONCAT22(uStack_1780,uStack_176e)));
      uVar4 = CONCAT26(uStack_17d2,CONCAT24(uStack_1782,CONCAT22(uStack_17d6,uStack_1786)));
      uVar5 = CONCAT26(uStack_17ca,CONCAT24(uStack_177a,CONCAT22(uStack_17ce,uStack_177e)));
      local_518 = auVar78._0_4_;
      uStack_514 = auVar78._4_4_;
      uStack_510 = auVar78._8_4_;
      uStack_50c = auVar78._12_4_;
      local_528 = auVar79._0_4_;
      uStack_524 = auVar79._4_4_;
      uStack_520 = auVar79._8_4_;
      uStack_51c = auVar79._12_4_;
      local_538 = auVar80._0_4_;
      uStack_534 = auVar80._4_4_;
      uStack_530 = auVar80._8_4_;
      uStack_52c = auVar80._12_4_;
      local_548 = auVar81._0_4_;
      uStack_544 = auVar81._4_4_;
      uStack_540 = auVar81._8_4_;
      uStack_53c = auVar81._12_4_;
      auVar78 = ZEXT416(6);
      auVar79 = ZEXT416(6);
      local_1678 = CONCAT44((uStack_514 + uStack_524 + uStack_534 + uStack_544 >> auVar78) + 0x20 >>
                            auVar79,(local_518 + local_528 + local_538 + local_548 >> auVar78) +
                                    0x20 >> auVar79);
      uStack_1670._0_4_ =
           (uStack_510 + uStack_520 + uStack_530 + uStack_540 >> auVar78) + 0x20 >> auVar79;
      uStack_1670._4_4_ =
           (uStack_50c + uStack_51c + uStack_52c + uStack_53c >> auVar78) + 0x20 >> auVar79;
      auVar72._8_8_ = uStack_1670;
      auVar72._0_8_ = local_1678;
      auVar78 = packssdw(auVar72,ZEXT816(0));
      local_10e8 = auVar78._0_2_;
      uStack_10e6 = auVar78._2_2_;
      uStack_10e4 = auVar78._4_2_;
      uStack_10e2 = auVar78._6_2_;
      local_1688._0_2_ =
           CONCAT11((0 < uStack_10e6) * (uStack_10e6 < 0x100) * auVar78[2] - (0xff < uStack_10e6),
                    (0 < local_10e8) * (local_10e8 < 0x100) * auVar78[0] - (0xff < local_10e8));
      local_1688._0_3_ =
           CONCAT12((0 < uStack_10e4) * (uStack_10e4 < 0x100) * auVar78[4] - (0xff < uStack_10e4),
                    (undefined2)local_1688);
      local_1688 = CONCAT13((0 < uStack_10e2) * (uStack_10e2 < 0x100) * auVar78[6] -
                            (0xff < uStack_10e2),(undefined3)local_1688);
      *local_1588 = *local_1588 & 0xffffffff00000000 | (ulong)local_1688;
      auVar33._4_4_ = uVar77;
      auVar33._0_4_ = uVar77;
      auVar33._12_4_ = uVar77;
      auVar33._8_4_ = uVar77;
      auVar34._8_8_ = uVar10;
      auVar34._0_8_ = uVar3;
      auVar78 = pmaddwd(auVar34,auVar33);
      auVar31._4_4_ = uStack_1654;
      auVar31._0_4_ = uStack_1654;
      auVar31._12_4_ = uStack_1654;
      auVar31._8_4_ = uStack_1654;
      auVar32._8_8_ = uVar9;
      auVar32._0_8_ = uVar8;
      auVar79 = pmaddwd(auVar32,auVar31);
      auVar30._2_2_ = local_c68;
      auVar30._0_2_ = local_c58;
      auVar30._4_2_ = uStack_c56;
      auVar30._6_2_ = uStack_c66;
      auVar30._10_2_ = uStack_c64;
      auVar30._8_2_ = uStack_c54;
      auVar30._12_2_ = uStack_c52;
      auVar30._14_2_ = uStack_c62;
      auVar29._4_4_ = uStack_1650;
      auVar29._0_4_ = uStack_1650;
      auVar29._12_4_ = uStack_1650;
      auVar29._8_4_ = uStack_1650;
      auVar80 = pmaddwd(auVar30,auVar29);
      uVar2 = *(undefined8 *)((long)local_1580 + (long)in_EDX * 2);
      uVar3 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * 2) * 2);
      local_c78 = (undefined2)uVar2;
      local_1788 = local_c78;
      uStack_c76 = (undefined2)((ulong)uVar2 >> 0x10);
      uStack_1784 = uStack_c76;
      uStack_c74 = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_1780 = uStack_c74;
      uStack_c72 = (undefined2)((ulong)uVar2 >> 0x30);
      uStack_177c = uStack_c72;
      local_c88 = (undefined2)uVar3;
      uStack_1786 = local_c88;
      uStack_c86 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_1782 = uStack_c86;
      uStack_c84 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_177e = uStack_c84;
      uStack_c82 = (undefined2)((ulong)uVar3 >> 0x30);
      uStack_177a = uStack_c82;
      auVar28._2_2_ = local_c88;
      auVar28._0_2_ = local_c78;
      auVar28._4_2_ = uStack_c76;
      auVar28._6_2_ = uStack_c86;
      auVar28._10_2_ = uStack_c84;
      auVar28._8_2_ = uStack_c74;
      auVar28._12_2_ = uStack_c72;
      auVar28._14_2_ = uStack_c82;
      auVar27._4_4_ = uStack_164c;
      auVar27._0_4_ = uStack_164c;
      auVar27._12_4_ = uStack_164c;
      auVar27._8_4_ = uStack_164c;
      auVar81 = pmaddwd(auVar28,auVar27);
      local_598 = auVar78._0_4_;
      uStack_594 = auVar78._4_4_;
      uStack_590 = auVar78._8_4_;
      uStack_58c = auVar78._12_4_;
      local_5a8 = auVar79._0_4_;
      uStack_5a4 = auVar79._4_4_;
      uStack_5a0 = auVar79._8_4_;
      uStack_59c = auVar79._12_4_;
      local_5b8 = auVar80._0_4_;
      uStack_5b4 = auVar80._4_4_;
      uStack_5b0 = auVar80._8_4_;
      uStack_5ac = auVar80._12_4_;
      local_5c8 = auVar81._0_4_;
      uStack_5c4 = auVar81._4_4_;
      uStack_5c0 = auVar81._8_4_;
      uStack_5bc = auVar81._12_4_;
      auVar78 = ZEXT416(6);
      auVar79 = ZEXT416(6);
      local_18e8 = CONCAT44((uStack_594 + uStack_5a4 + uStack_5b4 + uStack_5c4 >> auVar78) + 0x20 >>
                            auVar79,(local_598 + local_5a8 + local_5b8 + local_5c8 >> auVar78) +
                                    0x20 >> auVar79);
      uStack_18e0._0_4_ =
           (uStack_590 + uStack_5a0 + uStack_5b0 + uStack_5c0 >> auVar78) + 0x20 >> auVar79;
      uStack_18e0._4_4_ =
           (uStack_58c + uStack_59c + uStack_5ac + uStack_5bc >> auVar78) + 0x20 >> auVar79;
      auVar71._8_8_ = uStack_18e0;
      auVar71._0_8_ = local_18e8;
      auVar78 = packssdw(auVar71,ZEXT816(0));
      local_1108 = auVar78._0_2_;
      uStack_1106 = auVar78._2_2_;
      uStack_1104 = auVar78._4_2_;
      uStack_1102 = auVar78._6_2_;
      local_18f8._0_2_ =
           CONCAT11((0 < uStack_1106) * (uStack_1106 < 0x100) * auVar78[2] - (0xff < uStack_1106),
                    (0 < local_1108) * (local_1108 < 0x100) * auVar78[0] - (0xff < local_1108));
      local_18f8._0_3_ =
           CONCAT12((0 < uStack_1104) * (uStack_1104 < 0x100) * auVar78[4] - (0xff < uStack_1104),
                    (undefined2)local_18f8);
      local_18f8 = CONCAT13((0 < uStack_1102) * (uStack_1102 < 0x100) * auVar78[6] -
                            (0xff < uStack_1102),(undefined3)local_18f8);
      *(ulong *)((long)local_1588 + (long)(in_ECX * 2)) =
           *(ulong *)((long)local_1588 + (long)(in_ECX * 2)) & 0xffffffff00000000 |
           (ulong)local_18f8;
      auVar25._4_4_ = uVar77;
      auVar25._0_4_ = uVar77;
      auVar25._12_4_ = uVar77;
      auVar25._8_4_ = uVar77;
      auVar26._8_8_ = uStack_17b0;
      auVar26._0_8_ = local_17b8;
      auVar78 = pmaddwd(auVar26,auVar25);
      auVar23._4_4_ = uStack_1654;
      auVar23._0_4_ = uStack_1654;
      auVar23._12_4_ = uStack_1654;
      auVar23._8_4_ = uStack_1654;
      auVar24._8_8_ = uVar7;
      auVar24._0_8_ = uVar6;
      auVar79 = pmaddwd(auVar24,auVar23);
      auVar21._4_4_ = uStack_1650;
      auVar21._0_4_ = uStack_1650;
      auVar21._12_4_ = uStack_1650;
      auVar21._8_4_ = uStack_1650;
      auVar22._8_8_ = uVar5;
      auVar22._0_8_ = uVar4;
      auVar80 = pmaddwd(auVar22,auVar21);
      auVar20._2_2_ = local_c78;
      auVar20._0_2_ = local_c68;
      auVar20._4_2_ = uStack_c66;
      auVar20._6_2_ = uStack_c76;
      auVar20._10_2_ = uStack_c74;
      auVar20._8_2_ = uStack_c64;
      auVar20._12_2_ = uStack_c62;
      auVar20._14_2_ = uStack_c72;
      auVar19._4_4_ = uStack_164c;
      auVar19._0_4_ = uStack_164c;
      auVar19._12_4_ = uStack_164c;
      auVar19._8_4_ = uStack_164c;
      auVar81 = pmaddwd(auVar20,auVar19);
      local_618 = auVar78._0_4_;
      uStack_614 = auVar78._4_4_;
      uStack_610 = auVar78._8_4_;
      uStack_60c = auVar78._12_4_;
      local_628 = auVar79._0_4_;
      uStack_624 = auVar79._4_4_;
      uStack_620 = auVar79._8_4_;
      uStack_61c = auVar79._12_4_;
      local_638 = auVar80._0_4_;
      uStack_634 = auVar80._4_4_;
      uStack_630 = auVar80._8_4_;
      uStack_62c = auVar80._12_4_;
      local_648 = auVar81._0_4_;
      uStack_644 = auVar81._4_4_;
      uStack_640 = auVar81._8_4_;
      uStack_63c = auVar81._12_4_;
      auVar78 = ZEXT416(6);
      auVar79 = ZEXT416(6);
      local_1858 = CONCAT44((uStack_614 + uStack_624 + uStack_634 + uStack_644 >> auVar78) + 0x20 >>
                            auVar79,(local_618 + local_628 + local_638 + local_648 >> auVar78) +
                                    0x20 >> auVar79);
      uStack_1850._0_4_ =
           (uStack_610 + uStack_620 + uStack_630 + uStack_640 >> auVar78) + 0x20 >> auVar79;
      uStack_1850._4_4_ =
           (uStack_60c + uStack_61c + uStack_62c + uStack_63c >> auVar78) + 0x20 >> auVar79;
      auVar70._8_8_ = uStack_1850;
      auVar70._0_8_ = local_1858;
      auVar78 = packssdw(auVar70,ZEXT816(0));
      local_1128 = auVar78._0_2_;
      uStack_1126 = auVar78._2_2_;
      uStack_1124 = auVar78._4_2_;
      uStack_1122 = auVar78._6_2_;
      local_1868._0_2_ =
           CONCAT11((0 < uStack_1126) * (uStack_1126 < 0x100) * auVar78[2] - (0xff < uStack_1126),
                    (0 < local_1128) * (local_1128 < 0x100) * auVar78[0] - (0xff < local_1128));
      local_1868._0_3_ =
           CONCAT12((0 < uStack_1124) * (uStack_1124 < 0x100) * auVar78[4] - (0xff < uStack_1124),
                    (undefined2)local_1868);
      local_1868 = CONCAT13((0 < uStack_1122) * (uStack_1122 < 0x100) * auVar78[6] -
                            (0xff < uStack_1122),(undefined3)local_1868);
      *(ulong *)((long)local_1588 + (long)in_ECX) =
           *(ulong *)((long)local_1588 + (long)in_ECX) & 0xffffffff00000000 | (ulong)local_1868;
      auVar17._4_4_ = uVar77;
      auVar17._0_4_ = uVar77;
      auVar17._12_4_ = uVar77;
      auVar17._8_4_ = uVar77;
      auVar18._8_8_ = uVar7;
      auVar18._0_8_ = uVar6;
      auVar78 = pmaddwd(auVar18,auVar17);
      auVar15._4_4_ = uStack_1654;
      auVar15._0_4_ = uStack_1654;
      auVar15._12_4_ = uStack_1654;
      auVar15._8_4_ = uStack_1654;
      auVar16._8_8_ = uVar5;
      auVar16._0_8_ = uVar4;
      auVar79 = pmaddwd(auVar16,auVar15);
      auVar14._2_2_ = local_c78;
      auVar14._0_2_ = local_c68;
      auVar14._4_2_ = uStack_c66;
      auVar14._6_2_ = uStack_c76;
      auVar14._10_2_ = uStack_c74;
      auVar14._8_2_ = uStack_c64;
      auVar14._12_2_ = uStack_c62;
      auVar14._14_2_ = uStack_c72;
      auVar13._4_4_ = uStack_1650;
      auVar13._0_4_ = uStack_1650;
      auVar13._12_4_ = uStack_1650;
      auVar13._8_4_ = uStack_1650;
      auVar80 = pmaddwd(auVar14,auVar13);
      local_1738 = *(undefined8 *)((long)local_1580 + (long)(in_EDX * 3) * 2);
      local_cc8 = (undefined2)local_1738;
      uStack_17d6 = local_cc8;
      uStack_cc6 = (undefined2)((ulong)local_1738 >> 0x10);
      uStack_17d2 = uStack_cc6;
      uStack_cc4 = (undefined2)((ulong)local_1738 >> 0x20);
      uStack_17ce = uStack_cc4;
      uStack_cc2 = (undefined2)((ulong)local_1738 >> 0x30);
      uStack_17ca = uStack_cc2;
      auVar12._2_2_ = local_cc8;
      auVar12._0_2_ = local_c88;
      auVar12._4_2_ = uStack_c86;
      auVar12._6_2_ = uStack_cc6;
      auVar12._10_2_ = uStack_cc4;
      auVar12._8_2_ = uStack_c84;
      auVar12._12_2_ = uStack_c82;
      auVar12._14_2_ = uStack_cc2;
      auVar11._4_4_ = uStack_164c;
      auVar11._0_4_ = uStack_164c;
      auVar11._12_4_ = uStack_164c;
      auVar11._8_4_ = uStack_164c;
      auVar81 = pmaddwd(auVar12,auVar11);
      local_698 = auVar78._0_4_;
      uStack_694 = auVar78._4_4_;
      uStack_690 = auVar78._8_4_;
      uStack_68c = auVar78._12_4_;
      local_6a8 = auVar79._0_4_;
      uStack_6a4 = auVar79._4_4_;
      uStack_6a0 = auVar79._8_4_;
      uStack_69c = auVar79._12_4_;
      local_6b8 = auVar80._0_4_;
      uStack_6b4 = auVar80._4_4_;
      uStack_6b0 = auVar80._8_4_;
      uStack_6ac = auVar80._12_4_;
      local_6c8 = auVar81._0_4_;
      uStack_6c4 = auVar81._4_4_;
      uStack_6c0 = auVar81._8_4_;
      uStack_6bc = auVar81._12_4_;
      auVar78 = ZEXT416(6);
      auVar79 = ZEXT416(6);
      local_1978 = CONCAT44((uStack_694 + uStack_6a4 + uStack_6b4 + uStack_6c4 >> auVar78) + 0x20 >>
                            auVar79,(local_698 + local_6a8 + local_6b8 + local_6c8 >> auVar78) +
                                    0x20 >> auVar79);
      uStack_1970._0_4_ =
           (uStack_690 + uStack_6a0 + uStack_6b0 + uStack_6c0 >> auVar78) + 0x20 >> auVar79;
      uStack_1970._4_4_ =
           (uStack_68c + uStack_69c + uStack_6ac + uStack_6bc >> auVar78) + 0x20 >> auVar79;
      auVar69._8_8_ = uStack_1970;
      auVar69._0_8_ = local_1978;
      auVar78 = packssdw(auVar69,ZEXT816(0));
      local_1148 = auVar78._0_2_;
      uStack_1146 = auVar78._2_2_;
      uStack_1144 = auVar78._4_2_;
      uStack_1142 = auVar78._6_2_;
      local_1988._0_2_ =
           CONCAT11((0 < uStack_1146) * (uStack_1146 < 0x100) * auVar78[2] - (0xff < uStack_1146),
                    (0 < local_1148) * (local_1148 < 0x100) * auVar78[0] - (0xff < local_1148));
      local_1988._0_3_ =
           CONCAT12((0 < uStack_1144) * (uStack_1144 < 0x100) * auVar78[4] - (0xff < uStack_1144),
                    (undefined2)local_1988);
      local_1988 = CONCAT13((0 < uStack_1142) * (uStack_1142 < 0x100) * auVar78[6] -
                            (0xff < uStack_1142),(undefined3)local_1988);
      *(ulong *)((long)local_1588 + (long)(in_ECX * 3)) =
           *(ulong *)((long)local_1588 + (long)(in_ECX * 3)) & 0xffffffff00000000 |
           (ulong)local_1988;
      local_1580 = (undefined8 *)((long)local_1580 + (long)(in_EDX << 2) * 2);
      local_1588 = (ulong *)((long)local_1588 + (long)(in_ECX << 2));
      local_17b8 = uVar4;
      uStack_17b0 = uVar5;
      uStack_1776 = local_c68;
      uStack_1772 = uStack_c66;
      uStack_176e = uStack_c64;
      uStack_176a = uStack_c62;
      local_1768 = uVar8;
      uStack_1760 = uVar9;
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16inp_ssse3(WORD16 *pi2_src,
                                             UWORD8 *pu1_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    WORD16 *pi2_src_copy;
    UWORD8 *pu1_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i s0_8x16b, s1_8x16b, s2_8x16b, s3_8x16b, s4_8x16b, s5_8x16b, s6_8x16b, s8_8x16b, s9_8x16b;
    __m128i s2_0_16x8b, s2_1_16x8b, s2_2_16x8b, s2_3_16x8b, s2_4_16x8b, s2_5_16x8b, s2_6_16x8b, s2_7_16x8b, s2_8_16x8b, s2_9_16x8b, s2_10_16x8b;
    __m128i s3_0_16x8b, s3_1_16x8b, s3_2_16x8b, s3_3_16x8b, s3_4_16x8b;
    __m128i s4_0_16x8b, s4_1_16x8b, s4_2_16x8b, s4_3_16x8b, s4_4_16x8b;
    __m128i s10_8x16b, s11_8x16b, s12_8x16b, s13_8x16b, s14_8x16b, s15_8x16b, s16_8x16b, s18_8x16b, s19_8x16b;
    __m128i s20_8x16b, s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b, s26_8x16b, s28_8x16b, s29_8x16b;
    __m128i s30_8x16b, s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b, s36_8x16b, s38_8x16b, s39_8x16b;

    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b, sign_reg;

/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    zero_8x16b = _mm_setzero_si128();
    sign_reg =  _mm_cmpgt_epi8(zero_8x16b, s4_8x16b);
    s5_8x16b  = _mm_unpacklo_epi8(s4_8x16b, sign_reg);

    coeff0_1_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(0, 0, 0, 0));  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(1, 1, 1, 1));  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(2, 2, 2, 2));  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(3, 3, 3, 3));  /* pi1_coeff[4] */


/* seting values in register */
    offset_8x16b = _mm_set1_epi32(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_set_epi32(0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0x00000000);
    mask_high_96b = _mm_set_epi32(0x00000000, 0x00000000, 0x00000000, 0xFFFFFFFF);


    pi2_src_copy = pi2_src;
    pu1_dst_copy = pu1_dst;

/*  outer for loop starts from here */
    for(col = 0; col < wd; col += 4)
    {

        pi2_src = pi2_src_copy + col;
        pu1_dst = pu1_dst_copy + col;

        /*load 4 pixel values */
        s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pi2_src + (-3 * src_strd)));

        /*load 4 pixel values */
        s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (-2 * src_strd)));

        s3_0_16x8b = _mm_unpacklo_epi16(s2_0_16x8b, s2_1_16x8b);

        s0_8x16b = _mm_madd_epi16(s3_0_16x8b, coeff0_1_8x16b);

        /*load 4 pixel values */
        s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (-1 * src_strd)));

        /*load 4 pixel values */
        s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (0 * src_strd)));

        s3_1_16x8b = _mm_unpacklo_epi16(s2_2_16x8b, s2_3_16x8b);

        s1_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff2_3_8x16b);

        /*load 4 pixel values */
        s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (1 * src_strd)));

        /*load 4 pixel values */
        s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

        s3_2_16x8b = _mm_unpacklo_epi16(s2_4_16x8b, s2_5_16x8b);

        s2_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

        /*load 4 pixel values */
        s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (4 * src_strd)));

        s3_3_16x8b = _mm_unpacklo_epi16(s2_6_16x8b, s2_7_16x8b);

        s3_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff6_7_8x16b);

        s4_8x16b = _mm_add_epi32(s0_8x16b, s1_8x16b);
        s5_8x16b = _mm_add_epi32(s2_8x16b, s3_8x16b);
        s6_8x16b = _mm_add_epi32(s4_8x16b, s5_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s8_8x16b = _mm_srai_epi32(s6_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s9_8x16b = _mm_add_epi32(s8_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s8_8x16b = _mm_srai_epi32(s9_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s8_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s9_8x16b = _mm_packus_epi16(s8_8x16b, zero_8x16b);

        s4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
        s5_8x16b =  _mm_and_si128(s4_8x16b, mask_low_32b);
        s6_8x16b =  _mm_and_si128(s9_8x16b, mask_high_96b);
        s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 0*/
        _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

        /* ROW 2*/
        s20_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff0_1_8x16b);
        s21_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff2_3_8x16b);
        s22_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (5 * src_strd)));

        /*load 4 pixel values */
        s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (6 * src_strd)));

        s3_4_16x8b = _mm_unpacklo_epi16(s2_8_16x8b, s2_9_16x8b);

        s23_8x16b = _mm_madd_epi16(s3_4_16x8b, coeff6_7_8x16b);

        s24_8x16b = _mm_add_epi32(s20_8x16b, s21_8x16b);
        s25_8x16b = _mm_add_epi32(s22_8x16b, s23_8x16b);
        s26_8x16b = _mm_add_epi32(s24_8x16b, s25_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s28_8x16b = _mm_srai_epi32(s26_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s29_8x16b = _mm_add_epi32(s28_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s28_8x16b = _mm_srai_epi32(s29_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s28_8x16b = _mm_packs_epi32(s28_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s29_8x16b = _mm_packus_epi16(s28_8x16b, zero_8x16b);

        s24_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (2 * dst_strd)));
        s25_8x16b =  _mm_and_si128(s24_8x16b, mask_low_32b);
        s26_8x16b =  _mm_and_si128(s29_8x16b, mask_high_96b);
        s29_8x16b = _mm_or_si128(s25_8x16b, s26_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 2*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), s29_8x16b);


        /*ROW 1*/
        s4_0_16x8b = _mm_unpacklo_epi16(s2_1_16x8b, s2_2_16x8b);

        s10_8x16b = _mm_madd_epi16(s4_0_16x8b, coeff0_1_8x16b);

        s4_1_16x8b = _mm_unpacklo_epi16(s2_3_16x8b, s2_4_16x8b);

        s11_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff2_3_8x16b);

        s4_2_16x8b = _mm_unpacklo_epi16(s2_5_16x8b, s2_6_16x8b);

        s12_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff4_5_8x16b);

        s4_3_16x8b = _mm_unpacklo_epi16(s2_7_16x8b, s2_8_16x8b);

        s13_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff6_7_8x16b);

        s14_8x16b = _mm_add_epi32(s10_8x16b, s11_8x16b);
        s15_8x16b = _mm_add_epi32(s12_8x16b, s13_8x16b);
        s16_8x16b = _mm_add_epi32(s14_8x16b, s15_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s18_8x16b = _mm_srai_epi32(s16_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s19_8x16b = _mm_add_epi32(s18_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s18_8x16b = _mm_srai_epi32(s19_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s18_8x16b = _mm_packs_epi32(s18_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s19_8x16b = _mm_packus_epi16(s18_8x16b, zero_8x16b);

        s14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (dst_strd)));
        s15_8x16b =  _mm_and_si128(s14_8x16b, mask_low_32b);
        s16_8x16b =  _mm_and_si128(s19_8x16b, mask_high_96b);
        s19_8x16b = _mm_or_si128(s15_8x16b, s16_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 1*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd)), s19_8x16b);


        /* ROW 3*/
        s30_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff0_1_8x16b);
        s31_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff2_3_8x16b);
        s32_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (7 * src_strd)));

        s4_4_16x8b = _mm_unpacklo_epi16(s2_9_16x8b, s2_10_16x8b);

        s33_8x16b = _mm_madd_epi16(s4_4_16x8b, coeff6_7_8x16b);

        s34_8x16b = _mm_add_epi32(s30_8x16b, s31_8x16b);
        s35_8x16b = _mm_add_epi32(s32_8x16b, s33_8x16b);
        s36_8x16b = _mm_add_epi32(s34_8x16b, s35_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s38_8x16b = _mm_srai_epi32(s36_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s39_8x16b = _mm_add_epi32(s38_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s38_8x16b = _mm_srai_epi32(s39_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s38_8x16b = _mm_packs_epi32(s38_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s39_8x16b = _mm_packus_epi16(s38_8x16b, zero_8x16b);

        s34_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (3 * dst_strd)));
        s35_8x16b =  _mm_and_si128(s34_8x16b, mask_low_32b);
        s36_8x16b =  _mm_and_si128(s39_8x16b, mask_high_96b);
        s39_8x16b = _mm_or_si128(s35_8x16b, s36_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 2*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), s39_8x16b);

        pi2_src += (8 * src_strd);
        pu1_dst += (4 * dst_strd);

        for(row = 4; row < ht; row += 4)
        {

            s3_0_16x8b = s3_2_16x8b;
            s3_1_16x8b = s3_3_16x8b;
            s3_2_16x8b = s3_4_16x8b;

            s0_8x16b = _mm_madd_epi16(s3_0_16x8b, coeff0_1_8x16b);
            s1_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff2_3_8x16b);
            s2_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 4)th row*/
            s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src));

            s3_3_16x8b = _mm_unpacklo_epi16(s2_10_16x8b, s2_0_16x8b);
            s3_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_0_16x8b = s4_2_16x8b;
            s4_1_16x8b = s4_3_16x8b;
            s4_2_16x8b = s4_4_16x8b;

            s4_8x16b = _mm_add_epi32(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi32(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi32(s4_8x16b, s5_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s8_8x16b = _mm_srai_epi32(s6_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s9_8x16b = _mm_add_epi32(s8_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s8_8x16b = _mm_srai_epi32(s9_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s8_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s9_8x16b = _mm_packus_epi16(s8_8x16b, zero_8x16b);

            s4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
            s5_8x16b =  _mm_and_si128(s4_8x16b, mask_low_32b);
            s6_8x16b =  _mm_and_si128(s9_8x16b, mask_high_96b);
            s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 4*/
            _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

/* row + 2*/
            s20_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 5)th row*/
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + src_strd));

            /*load 4 pixel values from (cur_row + 6)th row*/
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

            /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
            s3_4_16x8b = _mm_unpacklo_epi16(s2_1_16x8b, s2_2_16x8b);

            s23_8x16b = _mm_madd_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi32(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi32(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi32(s24_8x16b, s25_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s28_8x16b = _mm_srai_epi32(s26_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s29_8x16b = _mm_add_epi32(s28_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s28_8x16b = _mm_srai_epi32(s29_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s28_8x16b = _mm_packs_epi32(s28_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s29_8x16b = _mm_packus_epi16(s28_8x16b, zero_8x16b);

            s24_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (2 * dst_strd)));
            s25_8x16b =  _mm_and_si128(s24_8x16b, mask_low_32b);
            s26_8x16b =  _mm_and_si128(s29_8x16b, mask_high_96b);
            s29_8x16b = _mm_or_si128(s25_8x16b, s26_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row+2)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), s29_8x16b);


/*row + 1*/
            s10_8x16b = _mm_madd_epi16(s4_0_16x8b, coeff0_1_8x16b);
            s11_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff2_3_8x16b);
            s12_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff4_5_8x16b);

            /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
            s4_3_16x8b = _mm_unpacklo_epi16(s2_0_16x8b, s2_1_16x8b);
            s13_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi32(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi32(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi32(s14_8x16b, s15_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s18_8x16b = _mm_srai_epi32(s16_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s19_8x16b = _mm_add_epi32(s18_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s18_8x16b = _mm_srai_epi32(s19_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s18_8x16b = _mm_packs_epi32(s18_8x16b, zero_8x16b);

            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s19_8x16b = _mm_packus_epi16(s18_8x16b, zero_8x16b);

            s14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
            s15_8x16b =  _mm_and_si128(s14_8x16b, mask_low_32b);
            s16_8x16b =  _mm_and_si128(s19_8x16b, mask_high_96b);
            s19_8x16b = _mm_or_si128(s15_8x16b, s16_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row + 1)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s19_8x16b);


/* row + 3*/
            s30_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 7)th row*/
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

            /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
            s4_4_16x8b = _mm_unpacklo_epi16(s2_2_16x8b, s2_3_16x8b);

            s33_8x16b = _mm_madd_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi32(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi32(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi32(s34_8x16b, s35_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s38_8x16b = _mm_srai_epi32(s36_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s39_8x16b = _mm_add_epi32(s38_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s38_8x16b = _mm_srai_epi32(s39_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s38_8x16b = _mm_packs_epi32(s38_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s39_8x16b = _mm_packus_epi16(s38_8x16b, zero_8x16b);

            s34_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (3 * dst_strd)));
            s35_8x16b =  _mm_and_si128(s34_8x16b, mask_low_32b);
            s36_8x16b =  _mm_and_si128(s39_8x16b, mask_high_96b);
            s39_8x16b = _mm_or_si128(s35_8x16b, s36_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row+3)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), s39_8x16b);

            s2_10_16x8b = s2_3_16x8b;

            pi2_src += 4 * src_strd; /* pointer update */
            pu1_dst += 4 * dst_strd; /* pointer update */
        }
    }

}